

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CS248::Viewer::update(void)

{
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [55];
  allocator local_21;
  string local_20 [32];
  
  glClear(0x4100);
  if (renderer != (long *)0x0) {
    (**(code **)(*renderer + 0x18))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"post render",&local_21);
  checkGLError((string *)0x2082d2);
  std::__cxx11::string::~string(local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  if ((showInfo & 1) != 0) {
    drawInfo();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"post drawInfo",&local_59);
  checkGLError((string *)0x20837e);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  drawError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"post drawError",&local_81);
  checkGLError((string *)0x2083cd);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  glfwSwapBuffers(window);
  glfwPollEvents();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"end of Viewer::update",&local_a9);
  checkGLError((string *)0x208425);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return;
}

Assistant:

void Viewer::update() {

  // clear frame
  glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  // run user renderer
  if (renderer) {
    renderer->render();
  }

  checkGLError("post render");

  // FIXME(kayvonf): commented out for now since it was throwing GL errors

  // draw info
  if (showInfo) {
   drawInfo();
  }

  checkGLError("post drawInfo");

  drawError();

  checkGLError("post drawError");

  // swap buffers
  glfwSwapBuffers(window); 

  // poll events
  glfwPollEvents();

  checkGLError("end of Viewer::update");

}